

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

int __thiscall CTcTokenizer::peek_ahead(CTcTokenizer *this,char *s1,char *s2)

{
  int iVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  size_t sVar4;
  
  iVar3 = 0;
  if ((this->curtok_).typ_ == TOKT_SYM) {
    sVar4 = strlen(s1);
    iVar1 = cur_tok_matches(this,s1,sVar4);
    iVar3 = 0;
    if (iVar1 != 0) {
      tVar2 = next(this);
      iVar3 = 0;
      if (tVar2 == TOKT_SYM) {
        sVar4 = strlen(s2);
        iVar3 = cur_tok_matches(this,s2,sVar4);
      }
      unget(this);
    }
  }
  return iVar3;
}

Assistant:

int CTcTokenizer::peek_ahead(const char *s1, const char *s2)
{
    /* if the first token doesn't match, the sequence doesn't match */
    if (cur() != TOKT_SYM || !cur_tok_matches(s1, strlen(s1)))
        return FALSE;

    /* check the next token - if it matches, we have a sequence match */
    int match = (next() == TOKT_SYM && cur_tok_matches(s2, strlen(s2)));

    /* whatever happened, un-get the second token, since we're just peeking */
    unget();

    /* return the match indication */
    return match;
}